

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

ExprBase *
CreateMemberAccess(ExpressionContext *ctx,SynBase *source,ExprBase *value,SynIdentifier *member,
                  bool allowFailure)

{
  longlong lVar1;
  undefined8 uVar2;
  Allocator *pAVar3;
  FunctionData *pFVar4;
  TypeHandle *pTVar5;
  TypeHandle *pTVar6;
  TypeFunction *pTVar7;
  long lVar8;
  FunctionLookupChain chain;
  FunctionLookupChain chain_00;
  FunctionLookupChain chain_01;
  FunctionLookupChain chain_02;
  FunctionLookupChain chain_03;
  FunctionLookupChain chain_04;
  bool bVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  VariableHandle *variable;
  undefined4 extraout_var_03;
  TypeRef *pTVar13;
  undefined4 extraout_var_04;
  VariableData *pVVar14;
  ExprBase *first;
  _func_int **pp_Var15;
  undefined8 *puVar16;
  undefined8 *puVar17;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  TypeBase *pTVar18;
  TypeRef *pTVar19;
  TypeRef *value_00;
  FunctionHandle *pFVar20;
  TypeFunctionSet *pTVar21;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  ExprBase *pEVar22;
  TypeRef *pTVar23;
  undefined4 extraout_var_15;
  TypeUnsizedArray *type;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  TypeError *pTVar24;
  ulong uVar25;
  TypeBase *pTVar26;
  char *pcVar27;
  long lVar28;
  long *plVar29;
  TypeClass *parent;
  ulong uVar30;
  undefined **ppuVar31;
  bool bVar32;
  ArrayView<TypeBase_*> setTypes;
  IntrusiveList<FunctionHandle> overloads;
  FunctionLookupChain function_5;
  FunctionLookupChain function_4;
  FunctionLookupChain function_3;
  FunctionLookupChain function_2;
  FunctionLookupChain function_1;
  FunctionLookupChain function;
  SmallArray<TypeBase_*,_16U> types;
  FunctionValue bestOverload;
  TypeRef *local_4b0;
  IntrusiveList<FunctionHandle> local_488;
  TypeUnsizedArray *local_478;
  FunctionLookupChain local_470;
  FunctionLookupChain local_458;
  FunctionLookupChain local_440;
  FunctionLookupChain local_428;
  FunctionLookupChain local_410;
  FunctionLookupChain local_3f8;
  SmallArray<TypeBase_*,_16U> local_3e0;
  undefined1 local_348 [8];
  FunctionData *local_340;
  SynBase local_338 [12];
  Allocator *local_38;
  undefined4 extraout_var_02;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_12;
  
  pTVar18 = value->type;
  if ((pTVar18 == (TypeBase *)0x0) || (pTVar26 = pTVar18, pTVar18->typeID != 0x12)) {
    pTVar26 = (TypeBase *)0x0;
  }
  local_4b0 = (TypeRef *)value;
  if (pTVar26 == (TypeBase *)0x0) {
    if ((value == (ExprBase *)0x0) || (pEVar22 = value, value->typeID != 0x22)) {
      pEVar22 = (ExprBase *)0x0;
    }
    pTVar23 = (TypeRef *)value;
    if (pEVar22 == (ExprBase *)0x0) {
      if ((value == (ExprBase *)0x0) || (pEVar22 = value, value->typeID != 0x16)) {
        pEVar22 = (ExprBase *)0x0;
      }
      ppuVar31 = (undefined **)source;
      if (pEVar22 == (ExprBase *)0x0) {
        if ((pTVar18 == (TypeBase *)0x0) || (pTVar18->typeID != 0x12)) {
          bVar32 = AssertValueExpression(ctx,source,value);
          if (!bVar32) {
            iVar10 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
            ppuVar31 = (undefined **)CONCAT44(extraout_var_11,iVar10);
            pTVar24 = ExpressionContext::GetErrorType(ctx);
            (((TypeRef *)ppuVar31)->super_TypeBase).typeID = 0x1a;
            (((TypeRef *)ppuVar31)->super_TypeBase).name.begin = (char *)source;
            (((TypeRef *)ppuVar31)->super_TypeBase).name.end = (char *)pTVar24;
            bVar32 = false;
            (((TypeRef *)ppuVar31)->super_TypeBase).importModule = (ModuleData *)0x0;
            *(undefined1 *)&(((TypeRef *)ppuVar31)->super_TypeBase).typeIndex = 0;
            (((TypeRef *)ppuVar31)->super_TypeBase)._vptr_TypeBase =
                 (_func_int **)&PTR__ExprBase_00248c78;
            (((TypeRef *)ppuVar31)->super_TypeBase).size = (longlong)value;
            (((TypeRef *)ppuVar31)->super_TypeBase).padding = 0;
            (((TypeRef *)ppuVar31)->super_TypeBase).isGeneric = false;
            (((TypeRef *)ppuVar31)->super_TypeBase).hasPointers = false;
            (((TypeRef *)ppuVar31)->super_TypeBase).hasTranslation = false;
            (((TypeRef *)ppuVar31)->super_TypeBase).field_0x3f = 0;
            goto LAB_0016f7d5;
          }
          ppuVar31 = (undefined **)ExpressionContext::MakeInternal(ctx,source);
          pVVar14 = anon_unknown.dwarf_c6b42::AllocateTemporary(ctx,(SynBase *)ppuVar31,value->type)
          ;
          pEVar22 = CreateVariableAccess(ctx,(SynBase *)ppuVar31,pVVar14,false);
          pEVar22 = CreateAssignment(ctx,(SynBase *)ppuVar31,pEVar22,value);
          iVar10 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
          first = (ExprBase *)CONCAT44(extraout_var_05,iVar10);
          pTVar18 = ctx->typeVoid;
          iVar10 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
          pp_Var15 = (_func_int **)CONCAT44(extraout_var_06,iVar10);
          *pp_Var15 = (_func_int *)0x0;
          pp_Var15[1] = (_func_int *)pVVar14;
          pp_Var15[2] = (_func_int *)0x0;
          *(undefined1 *)(pp_Var15 + 3) = 0;
          first->typeID = 0x1e;
          first->source = (SynBase *)ppuVar31;
          first->type = pTVar18;
          first->next = (ExprBase *)0x0;
          first->listed = false;
          first->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00248a48;
          first[1]._vptr_ExprBase = pp_Var15;
          *(ExprBase **)&first[1].typeID = pEVar22;
          pEVar22 = CreateVariableAccess(ctx,(SynBase *)ppuVar31,pVVar14,false);
          pEVar22 = CreateGetAddress(ctx,(SynBase *)ppuVar31,pEVar22);
          local_4b0 = (TypeRef *)CreateSequence(ctx,source,first,pEVar22);
        }
      }
      else {
        local_4b0 = (TypeRef *)pEVar22[1]._vptr_ExprBase;
      }
    }
    else {
      iVar10 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
      local_4b0 = (TypeRef *)CONCAT44(extraout_var_01,iVar10);
      ppuVar31 = (undefined **)ExpressionContext::GetReferenceType(ctx,value->type);
      iVar10 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
      variable = (VariableHandle *)CONCAT44(extraout_var_02,iVar10);
      pVVar14 = (VariableData *)pEVar22[1]._vptr_ExprBase;
      variable->source = pEVar22->source;
      variable->variable = pVVar14;
      variable->next = (VariableHandle *)0x0;
      variable->listed = false;
      ExprGetAddress::ExprGetAddress
                ((ExprGetAddress *)local_4b0,source,(TypeBase *)ppuVar31,variable);
    }
    bVar32 = true;
  }
  else {
    iVar10 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
    pTVar23 = (TypeRef *)CONCAT44(extraout_var,iVar10);
    pTVar18 = (TypeBase *)pTVar26[1]._vptr_TypeBase;
    (pTVar23->super_TypeBase).typeID = 0x16;
    (pTVar23->super_TypeBase).name.begin = (char *)source;
    (pTVar23->super_TypeBase).name.end = (char *)pTVar18;
    (pTVar23->super_TypeBase).importModule = (ModuleData *)0x0;
    *(bool *)&(pTVar23->super_TypeBase).typeIndex = false;
    ppuVar31 = &PTR__ExprBase_00248a80;
    (pTVar23->super_TypeBase)._vptr_TypeBase = (_func_int **)&PTR__ExprBase_00248a80;
    (pTVar23->super_TypeBase).size = (longlong)value;
    if ((pTVar18 == (TypeBase *)0x0) || (pTVar18->typeID != 0x12)) {
      pTVar18 = (TypeBase *)0x0;
    }
    bVar32 = true;
    if (pTVar18 != (TypeBase *)0x0) {
      iVar10 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
      pTVar13 = (TypeRef *)CONCAT44(extraout_var_00,iVar10);
      pTVar18 = (TypeBase *)pTVar18[1]._vptr_TypeBase;
      (pTVar13->super_TypeBase).typeID = 0x16;
      (pTVar13->super_TypeBase).name.begin = (char *)source;
      (pTVar13->super_TypeBase).name.end = (char *)pTVar18;
      (pTVar13->super_TypeBase).importModule = (ModuleData *)0x0;
      *(bool *)&(pTVar13->super_TypeBase).typeIndex = false;
      (pTVar13->super_TypeBase)._vptr_TypeBase = (_func_int **)&PTR__ExprBase_00248a80;
      (pTVar13->super_TypeBase).size = (longlong)pTVar23;
      local_4b0 = pTVar23;
      pTVar23 = pTVar13;
    }
  }
LAB_0016f7d5:
  if (bVar32) {
    if (member == (SynIdentifier *)0x0) {
      iVar10 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
      ppuVar31 = (undefined **)CONCAT44(extraout_var_04,iVar10);
      pTVar24 = ExpressionContext::GetErrorType(ctx);
      (((TypeRef *)ppuVar31)->super_TypeBase).typeID = 0x1a;
      (((TypeRef *)ppuVar31)->super_TypeBase).name.begin = (char *)source;
      (((TypeRef *)ppuVar31)->super_TypeBase).name.end = (char *)pTVar24;
      (((TypeRef *)ppuVar31)->super_TypeBase).importModule = (ModuleData *)0x0;
      *(undefined1 *)&(((TypeRef *)ppuVar31)->super_TypeBase).typeIndex = 0;
      (((TypeRef *)ppuVar31)->super_TypeBase)._vptr_TypeBase = (_func_int **)&PTR__ExprBase_00248c78
      ;
      (((TypeRef *)ppuVar31)->super_TypeBase).size = (longlong)pTVar23;
      (((TypeRef *)ppuVar31)->super_TypeBase).padding = 0;
      (((TypeRef *)ppuVar31)->super_TypeBase).isGeneric = false;
      (((TypeRef *)ppuVar31)->super_TypeBase).hasPointers = false;
      (((TypeRef *)ppuVar31)->super_TypeBase).hasTranslation = false;
      (((TypeRef *)ppuVar31)->super_TypeBase).field_0x3f = 0;
    }
    else {
      pTVar18 = (TypeBase *)(pTVar23->super_TypeBase).name.end;
      if ((pTVar18 == (TypeBase *)0x0) || (pTVar18->typeID != 0x13)) {
        pTVar18 = (TypeBase *)0x0;
      }
      bVar32 = true;
      if (pTVar18 != (TypeBase *)0x0) {
        local_348 = (undefined1  [8])0x20d7ee;
        local_340 = (FunctionData *)0x20d7f2;
        bVar9 = InplaceStr::operator==(&member->name,(InplaceStr *)local_348);
        if (bVar9) {
          iVar10 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
          ppuVar31 = (undefined **)CONCAT44(extraout_var_03,iVar10);
          pTVar26 = ctx->typeInt;
          lVar1 = *(longlong *)&pTVar18[1].typeID;
          (((TypeRef *)ppuVar31)->super_TypeBase).typeID = 6;
          (((TypeRef *)ppuVar31)->super_TypeBase).name.begin = (char *)source;
          (((TypeRef *)ppuVar31)->super_TypeBase).name.end = (char *)pTVar26;
          (((TypeRef *)ppuVar31)->super_TypeBase).importModule = (ModuleData *)0x0;
          *(undefined1 *)&(((TypeRef *)ppuVar31)->super_TypeBase).typeIndex = 0;
          (((TypeRef *)ppuVar31)->super_TypeBase)._vptr_TypeBase =
               (_func_int **)&PTR__ExprBase_00248500;
          (((TypeRef *)ppuVar31)->super_TypeBase).size = lVar1;
          bVar32 = false;
        }
      }
      if (bVar32) {
        pTVar18 = (TypeBase *)(local_4b0->super_TypeBase).name.end;
        if ((pTVar18 == (TypeBase *)0x0) || (pTVar18->typeID != 0x12)) {
          pcVar27 = (member->name).begin;
          pTVar18 = (TypeBase *)(pTVar23->super_TypeBase).name.end;
          iVar10 = (int)(pTVar18->name).begin;
          anon_unknown.dwarf_c6b42::Stop
                    (ctx,source,"ERROR: can\'t access member \'%.*s\' of type \'%.*s\'",
                     (ulong)(uint)(*(int *)&(member->name).end - (int)pcVar27),pcVar27,
                     (ulong)(uint)(*(int *)&(pTVar18->name).end - iVar10),iVar10);
        }
        if ((pTVar23 == (TypeRef *)0x0) ||
           (pTVar13 = pTVar23, (pTVar23->super_TypeBase).typeID != 8)) {
          pTVar13 = (TypeRef *)0x0;
        }
        if (pTVar13 == (TypeRef *)0x0) {
          bVar32 = true;
        }
        else {
          pTVar13 = (TypeRef *)
                    CreateTypeidMemberAccess
                              (ctx,source,(TypeBase *)(pTVar13->super_TypeBase).size,member);
          bVar32 = pTVar13 == (TypeRef *)0x0;
          if (!bVar32) {
            ppuVar31 = (undefined **)pTVar13;
          }
        }
        if (bVar32) {
          pTVar18 = (TypeBase *)(pTVar23->super_TypeBase).name.end;
          if (((pTVar18 == (TypeBase *)0x0) || (0x19 < pTVar18->typeID)) ||
             ((0x3130000U >> (pTVar18->typeID & 0x1f) & 1) == 0)) {
            pTVar18 = (TypeBase *)0x0;
          }
          if (pTVar18 == (TypeBase *)0x0) {
            bVar32 = true;
          }
          else {
            lVar28._0_4_ = pTVar18[1].typeID;
            lVar28._4_4_ = pTVar18[1].nameHash;
            bVar32 = lVar28 == 0;
            if (!bVar32) {
              do {
                bVar9 = InplaceStr::operator==
                                  ((InplaceStr *)(*(long *)(*(long *)(lVar28 + 8) + 0x28) + 0x40),
                                   &member->name);
                if (bVar9) {
                  iVar10 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
                  puVar16 = (undefined8 *)CONCAT44(extraout_var_07,iVar10);
                  pTVar13 = ExpressionContext::GetReferenceType
                                      (ctx,*(TypeBase **)(*(long *)(lVar28 + 8) + 0x20));
                  iVar10 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
                  puVar17 = (undefined8 *)CONCAT44(extraout_var_08,iVar10);
                  uVar2 = *(undefined8 *)(lVar28 + 8);
                  *puVar17 = member;
                  puVar17[1] = uVar2;
                  puVar17[2] = 0;
                  *(undefined1 *)(puVar17 + 3) = 0;
                  *(undefined4 *)(puVar16 + 1) = 0x1a;
                  puVar16[2] = source;
                  puVar16[3] = pTVar13;
                  puVar16[4] = 0;
                  *(undefined1 *)(puVar16 + 5) = 0;
                  *puVar16 = &PTR__ExprBase_00248c78;
                  puVar16[6] = local_4b0;
                  puVar16[7] = puVar17;
                  iVar10 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
                  pTVar13 = (TypeRef *)CONCAT44(extraout_var_09,iVar10);
                  lVar28 = *(long *)(lVar28 + 8);
                  pcVar27 = *(char **)(lVar28 + 0x20);
                  (pTVar13->super_TypeBase).typeID = 0x16;
                  (pTVar13->super_TypeBase).name.begin = (char *)source;
                  (pTVar13->super_TypeBase).name.end = pcVar27;
                  (pTVar13->super_TypeBase).importModule = (ModuleData *)0x0;
                  *(undefined1 *)&(pTVar13->super_TypeBase).typeIndex = 0;
                  (pTVar13->super_TypeBase)._vptr_TypeBase = (_func_int **)&PTR__ExprBase_00248a80;
                  (pTVar13->super_TypeBase).size = (longlong)puVar16;
                  ppuVar31 = (undefined **)pTVar13;
                  if (*(char *)(lVar28 + 0x35) == '\x01') {
                    iVar10 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
                    ppuVar31 = (undefined **)CONCAT44(extraout_var_10,iVar10);
                    ExprPassthrough::ExprPassthrough
                              ((ExprPassthrough *)ppuVar31,
                               (SynBase *)(pTVar13->super_TypeBase).name.begin,
                               (TypeBase *)(pTVar13->super_TypeBase).name.end,(ExprBase *)pTVar13);
                  }
                  break;
                }
                lVar28 = *(long *)(lVar28 + 0x18);
                bVar32 = lVar28 == 0;
              } while (!bVar32);
            }
            if (bVar32) {
              plVar29 = (long *)pTVar18[1].name.end;
              bVar32 = plVar29 == (long *)0x0;
              if (!bVar32) {
                do {
                  bVar9 = InplaceStr::operator==((InplaceStr *)(*plVar29 + 0x40),&member->name);
                  if (bVar9) {
                    ppuVar31 = (undefined **)CreateLiteralCopy(ctx,source,(ExprBase *)plVar29[1]);
                    break;
                  }
                  plVar29 = (long *)plVar29[2];
                  bVar32 = plVar29 == (long *)0x0;
                } while (!bVar32);
              }
            }
            else {
              bVar32 = false;
            }
          }
          if (bVar32) {
            parent = (TypeClass *)(pTVar23->super_TypeBase).name.end;
            if (parent == (TypeClass *)ctx->typeAutoRef) {
              ppuVar31 = (undefined **)
                         CreateAutoRefFunctionSet(ctx,source,(ExprBase *)pTVar23,member->name);
            }
            else {
              if ((parent == (TypeClass *)0x0) ||
                 ((parent->super_TypeStruct).super_TypeBase.typeID != 0x18)) {
                parent = (TypeClass *)0x0;
              }
              bVar32 = true;
              if ((parent != (TypeClass *)0x0) &&
                 ((parent->baseClass != (TypeClass *)0x0 || (parent->extendable == true)))) {
                pTVar13 = (TypeRef *)
                          CreateVirtualFunctionSet
                                    (ctx,source,(ExprBase *)local_4b0,member->name,parent);
                bVar32 = pTVar13 == (TypeRef *)0x0;
                if (!bVar32) {
                  ppuVar31 = (undefined **)pTVar13;
                }
              }
              if (bVar32) {
                uVar11 = NULLC::GetStringHash((member->name).begin,(member->name).end);
                pTVar18 = anon_unknown.dwarf_c6b42::LookupTypeByName(ctx,uVar11);
                if ((pTVar18 == (TypeBase *)0x0) ||
                   (pTVar18 != (TypeBase *)(pTVar23->super_TypeBase).name.end)) {
                  bVar32 = false;
                }
                else {
                  bVar32 = InplaceStr::operator==(&pTVar18->name,&member->name);
                  bVar32 = !bVar32;
                }
                uVar11 = NULLC::StringHashContinue
                                   (((TypeBase *)(pTVar23->super_TypeBase).name.end)->nameHash,"::")
                ;
                uVar11 = NULLC::StringHashContinue(uVar11,(member->name).begin,(member->name).end);
                anon_unknown.dwarf_c6b42::LookupFunctionChainByName(&local_3f8,ctx,uVar11);
                if (local_3f8.node.node == (Node *)0x0) {
                  pTVar13 = (TypeRef *)0x0;
                }
                else {
                  chain.node.node = local_3f8.node.node;
                  chain.node.start = local_3f8.node.start;
                  chain.scope = local_3f8.scope;
                  pTVar13 = (TypeRef *)CreateFunctionAccess(ctx,source,chain,(ExprBase *)local_4b0);
                }
                if (pTVar13 == (TypeRef *)0x0 && !(bool)(bVar32 ^ 1U)) {
                  pTVar13 = (TypeRef *)
                            CreateConstructorAccess
                                      (ctx,source,(TypeBase *)(pTVar23->super_TypeBase).name.end,
                                       false,(ExprBase *)local_4b0);
                }
                pTVar19 = (TypeRef *)ppuVar31;
                if (pTVar13 == (TypeRef *)0x0) {
                  pTVar18 = (TypeBase *)(pTVar23->super_TypeBase).name.end;
                  if ((pTVar18 == (TypeBase *)0x0) || (pTVar18->typeID != 0x13)) {
                    pTVar18 = (TypeBase *)0x0;
                  }
                  if (pTVar18 == (TypeBase *)0x0) {
                    bVar9 = true;
                  }
                  else {
                    local_478 = ExpressionContext::GetUnsizedArrayType
                                          (ctx,(TypeBase *)pTVar18[1]._vptr_TypeBase);
                    uVar12 = NULLC::StringHashContinue
                                       ((local_478->super_TypeStruct).super_TypeBase.nameHash,"::");
                    uVar12 = NULLC::StringHashContinue
                                       (uVar12,(member->name).begin,(member->name).end);
                    anon_unknown.dwarf_c6b42::LookupFunctionChainByName(&local_410,ctx,uVar12);
                    bVar9 = local_410.node.node == (Node *)0x0;
                    if (!bVar9) {
                      pTVar19 = ExpressionContext::GetReferenceType(ctx,(TypeBase *)local_478);
                      local_4b0 = (TypeRef *)
                                  CreateCast(ctx,source,(ExprBase *)local_4b0,
                                             &pTVar19->super_TypeBase,false);
                      chain_00.node.node = local_410.node.node;
                      chain_00.node.start = local_410.node.start;
                      chain_00.scope = local_410.scope;
                      ppuVar31 = (undefined **)
                                 CreateFunctionAccess(ctx,source,chain_00,(ExprBase *)local_4b0);
                    }
                  }
                  pTVar19 = (TypeRef *)ppuVar31;
                  if (!bVar9) {
                    return (ExprBase *)(TypeRef *)ppuVar31;
                  }
                }
                pTVar18 = (TypeBase *)(pTVar23->super_TypeBase).name.end;
                if ((pTVar18 == (TypeBase *)0x0) || (pTVar18->typeID != 0x18)) {
                  pTVar18 = (TypeBase *)0x0;
                }
                if ((pTVar18 == (TypeBase *)0x0) ||
                   (pTVar18 = *(TypeBase **)&pTVar18[2].typeIndex, pTVar18 == (TypeBase *)0x0)) {
                  value_00 = (TypeRef *)0x0;
                }
                else {
                  uVar12 = NULLC::StringHashContinue(pTVar18->nameHash,"::");
                  uVar12 = NULLC::StringHashContinue(uVar12,(member->name).begin,(member->name).end)
                  ;
                  anon_unknown.dwarf_c6b42::LookupFunctionChainByName(&local_428,ctx,uVar12);
                  if (local_428.node.node == (Node *)0x0) {
                    value_00 = (TypeRef *)0x0;
                  }
                  else {
                    chain_01.node.node = local_428.node.node;
                    chain_01.node.start = local_428.node.start;
                    chain_01.scope = local_428.scope;
                    value_00 = (TypeRef *)
                               CreateFunctionAccess(ctx,source,chain_01,(ExprBase *)local_4b0);
                  }
                  if (!(bool)(bVar32 ^ 1U) && value_00 == (TypeRef *)0x0) {
                    value_00 = (TypeRef *)
                               CreateConstructorAccess
                                         (ctx,source,pTVar18,false,(ExprBase *)local_4b0);
                  }
                }
                if ((pTVar13 == (TypeRef *)0x0) || (value_00 == (TypeRef *)0x0)) {
                  ppuVar31 = (undefined **)pTVar13;
                  if (pTVar13 == (TypeRef *)0x0) {
                    if (value_00 == (TypeRef *)0x0) {
                      uVar11 = NULLC::StringHashContinue(uVar11,"$");
                      anon_unknown.dwarf_c6b42::LookupFunctionChainByName(&local_440,ctx,uVar11);
                      if (local_440.node.node == (Node *)0x0) {
                        pEVar22 = (ExprBase *)0x0;
                      }
                      else {
                        chain_02.node.node = local_440.node.node;
                        chain_02.node.start = local_440.node.start;
                        chain_02.scope = local_440.scope;
                        pEVar22 = CreateFunctionAccess(ctx,source,chain_02,(ExprBase *)local_4b0);
                      }
                      if (pEVar22 == (ExprBase *)0x0) {
                        pTVar18 = (TypeBase *)(pTVar23->super_TypeBase).name.end;
                        if ((pTVar18 == (TypeBase *)0x0) || (pTVar18->typeID != 0x13)) {
                          pTVar18 = (TypeBase *)0x0;
                        }
                        if (pTVar18 == (TypeBase *)0x0) {
                          pEVar22 = (ExprBase *)0x0;
                        }
                        else {
                          type = ExpressionContext::GetUnsizedArrayType
                                           (ctx,(TypeBase *)pTVar18[1]._vptr_TypeBase);
                          uVar11 = NULLC::StringHashContinue
                                             ((type->super_TypeStruct).super_TypeBase.nameHash,"::")
                          ;
                          uVar11 = NULLC::StringHashContinue
                                             (uVar11,(member->name).begin,(member->name).end);
                          anon_unknown.dwarf_c6b42::LookupFunctionChainByName(&local_458,ctx,uVar11)
                          ;
                          if (local_458.node.node == (Node *)0x0) {
                            pEVar22 = (ExprBase *)0x0;
                          }
                          else {
                            pTVar13 = ExpressionContext::GetReferenceType(ctx,(TypeBase *)type);
                            local_4b0 = (TypeRef *)
                                        CreateCast(ctx,source,(ExprBase *)local_4b0,
                                                   &pTVar13->super_TypeBase,false);
                            chain_03.node.node = local_458.node.node;
                            chain_03.node.start = local_458.node.start;
                            chain_03.scope = local_458.scope;
                            pEVar22 = CreateFunctionAccess
                                                (ctx,source,chain_03,(ExprBase *)local_4b0);
                          }
                        }
                      }
                      if (pEVar22 == (ExprBase *)0x0) {
                        pTVar18 = (TypeBase *)(pTVar23->super_TypeBase).name.end;
                        if ((pTVar18 == (TypeBase *)0x0) || (pTVar18->typeID != 0x18)) {
                          pTVar18 = (TypeBase *)0x0;
                        }
                        if ((pTVar18 == (TypeBase *)0x0) || (*(long *)&pTVar18[2].typeIndex == 0)) {
                          bVar32 = false;
                        }
                        else {
                          uVar11 = NULLC::StringHashContinue
                                             (*(uint *)(*(long *)&pTVar18[2].typeIndex + 0xc),"::");
                          uVar11 = NULLC::StringHashContinue
                                             (uVar11,(member->name).begin,(member->name).end);
                          uVar11 = NULLC::StringHashContinue(uVar11,"$");
                          anon_unknown.dwarf_c6b42::LookupFunctionChainByName(&local_470,ctx,uVar11)
                          ;
                          bVar32 = local_470.node.node != (Node *)0x0;
                          if (bVar32) {
                            chain_04.node.node = local_470.node.node;
                            chain_04.node.start = local_470.node.start;
                            chain_04.scope = local_470.scope;
                            pEVar22 = CreateFunctionAccess
                                                (ctx,source,chain_04,(ExprBase *)local_4b0);
                            pTVar13 = (TypeRef *)
                                      CreateFunctionCall(ctx,source,pEVar22,
                                                         (IntrusiveList<TypeHandle>)ZEXT816(0),
                                                         (SynCallArgument *)0x0,false);
                            pcVar27 = (pTVar13->super_TypeBase).name.end;
                            if ((pcVar27 == (char *)0x0) || (*(int *)(pcVar27 + 8) != 0x12)) {
                              pcVar27 = (char *)0x0;
                            }
                            pTVar19 = pTVar13;
                            if (pcVar27 != (char *)0x0) {
                              iVar10 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
                              pTVar19 = (TypeRef *)CONCAT44(extraout_var_16,iVar10);
                              pcVar27 = *(char **)(pcVar27 + 0x60);
                              (pTVar19->super_TypeBase).typeID = 0x16;
                              (pTVar19->super_TypeBase).name.begin = (char *)source;
                              (pTVar19->super_TypeBase).name.end = pcVar27;
                              (pTVar19->super_TypeBase).importModule = (ModuleData *)0x0;
                              *(undefined1 *)&(pTVar19->super_TypeBase).typeIndex = 0;
                              (pTVar19->super_TypeBase)._vptr_TypeBase =
                                   (_func_int **)&PTR__ExprBase_00248a80;
                              (pTVar19->super_TypeBase).size = (longlong)pTVar13;
                            }
                          }
                        }
                        ppuVar31 = (undefined **)(TypeRef *)0x0;
                        if (bVar32) {
                          ppuVar31 = (undefined **)pTVar19;
                        }
                        if (!allowFailure && !bVar32) {
                          pcVar27 = (member->name).begin;
                          pTVar18 = (TypeBase *)(pTVar23->super_TypeBase).name.end;
                          iVar10 = (int)(pTVar18->name).begin;
                          anon_unknown.dwarf_c6b42::Report
                                    (ctx,source,
                                     "ERROR: member variable or function \'%.*s\' is not defined in class \'%.*s\'"
                                     ,(ulong)(uint)(*(int *)&(member->name).end - (int)pcVar27),
                                     pcVar27,(ulong)(uint)(*(int *)&(pTVar18->name).end - iVar10),
                                     iVar10);
                          iVar10 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
                          ppuVar31 = (undefined **)CONCAT44(extraout_var_17,iVar10);
                          pTVar24 = ExpressionContext::GetErrorType(ctx);
                          (((TypeRef *)ppuVar31)->super_TypeBase).typeID = 0x1a;
                          (((TypeRef *)ppuVar31)->super_TypeBase).name.begin = (char *)source;
                          (((TypeRef *)ppuVar31)->super_TypeBase).name.end = (char *)pTVar24;
                          (((TypeRef *)ppuVar31)->super_TypeBase).importModule = (ModuleData *)0x0;
                          *(undefined1 *)&(((TypeRef *)ppuVar31)->super_TypeBase).typeIndex = 0;
                          (((TypeRef *)ppuVar31)->super_TypeBase)._vptr_TypeBase =
                               (_func_int **)&PTR__ExprBase_00248c78;
                          (((TypeRef *)ppuVar31)->super_TypeBase).size = (longlong)pTVar23;
                          (((TypeRef *)ppuVar31)->super_TypeBase).padding = 0;
                          (((TypeRef *)ppuVar31)->super_TypeBase).isGeneric = false;
                          (((TypeRef *)ppuVar31)->super_TypeBase).hasPointers = false;
                          (((TypeRef *)ppuVar31)->super_TypeBase).hasTranslation = false;
                          (((TypeRef *)ppuVar31)->super_TypeBase).field_0x3f = 0;
                        }
                      }
                      else {
                        pTVar23 = (TypeRef *)
                                  CreateFunctionCall(ctx,source,pEVar22,
                                                     (IntrusiveList<TypeHandle>)ZEXT816(0),
                                                     (SynCallArgument *)0x0,false);
                        pcVar27 = (pTVar23->super_TypeBase).name.end;
                        if ((pcVar27 == (char *)0x0) || (*(int *)(pcVar27 + 8) != 0x12)) {
                          pcVar27 = (char *)0x0;
                        }
                        ppuVar31 = (undefined **)pTVar23;
                        if (pcVar27 != (char *)0x0) {
                          iVar10 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
                          ppuVar31 = (undefined **)CONCAT44(extraout_var_15,iVar10);
                          pcVar27 = *(char **)(pcVar27 + 0x60);
                          (((TypeRef *)ppuVar31)->super_TypeBase).typeID = 0x16;
                          (((TypeRef *)ppuVar31)->super_TypeBase).name.begin = (char *)source;
                          (((TypeRef *)ppuVar31)->super_TypeBase).name.end = pcVar27;
                          (((TypeRef *)ppuVar31)->super_TypeBase).importModule = (ModuleData *)0x0;
                          *(undefined1 *)&(((TypeRef *)ppuVar31)->super_TypeBase).typeIndex = 0;
                          (((TypeRef *)ppuVar31)->super_TypeBase)._vptr_TypeBase =
                               (_func_int **)&PTR__ExprBase_00248a80;
                          (((TypeRef *)ppuVar31)->super_TypeBase).size = (longlong)pTVar23;
                        }
                      }
                    }
                    else {
                      ppuVar31 = (undefined **)value_00;
                      if ((value_00->super_TypeBase).typeID == 0x26) {
                        lVar28 = (value_00->super_TypeBase).size;
                        lVar8 = *(long *)(*(long *)(lVar28 + 0x18) + 0x20);
                        if ((((lVar8 != 0) && (*(char *)(lVar8 + 0x3c) == '\x01')) &&
                            (pTVar7 = *(TypeFunction **)(lVar28 + 0x28),
                            (pTVar7->super_TypeBase).isGeneric == false)) &&
                           (GetFunctionForType((FunctionValue *)local_348,ctx,source,
                                               (ExprBase *)value_00,pTVar7), pFVar4 = local_340,
                           local_340 != (FunctionData *)0x0)) {
                          iVar10 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
                          ExprFunctionAccess::ExprFunctionAccess
                                    ((ExprFunctionAccess *)CONCAT44(extraout_var_14,iVar10),
                                     (SynBase *)local_348,&pFVar4->type->super_TypeBase,pFVar4,
                                     (ExprBase *)local_338[0]._vptr_SynBase);
                          ppuVar31 = (undefined **)CONCAT44(extraout_var_14,iVar10);
                        }
                      }
                    }
                  }
                }
                else {
                  pAVar3 = ctx->allocator;
                  local_3e0.data = local_3e0.little;
                  local_3e0.count = 0;
                  local_3e0.max = 0x10;
                  local_488.head = (FunctionHandle *)0x0;
                  local_488.tail = (FunctionHandle *)0x0;
                  local_3e0.allocator = pAVar3;
                  memset(local_338,0,0x300);
                  local_340 = (FunctionData *)0x2000000000;
                  local_348 = (undefined1  [8])local_338;
                  local_38 = pAVar3;
                  GetNodeFunctions(ctx,source,(ExprBase *)pTVar13,
                                   (SmallArray<FunctionValue,_32U> *)local_348);
                  GetNodeFunctions(ctx,source,(ExprBase *)value_00,
                                   (SmallArray<FunctionValue,_32U> *)local_348);
                  if ((uint)local_340 != 0) {
                    uVar30 = 0;
                    do {
                      pFVar4 = *(FunctionData **)((uint *)((long)local_348 + 8) + uVar30 * 6);
                      if (local_488.head == (FunctionHandle *)0x0) {
LAB_00170104:
                        pTVar7 = pFVar4->type;
                        if (local_3e0.count == local_3e0.max) {
                          SmallArray<TypeBase_*,_16U>::grow(&local_3e0,local_3e0.count);
                        }
                        if (local_3e0.data == (TypeBase **)0x0) {
                          __assert_fail("data",
                                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                                        ,0x162,
                                        "void SmallArray<TypeBase *, 16>::push_back(const T &) [T = TypeBase *, N = 16]"
                                       );
                        }
                        uVar25 = (ulong)local_3e0.count;
                        local_3e0.count = local_3e0.count + 1;
                        local_3e0.data[uVar25] = &pTVar7->super_TypeBase;
                        iVar10 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x18);
                        pFVar20 = (FunctionHandle *)CONCAT44(extraout_var_12,iVar10);
                        pFVar20->function = pFVar4;
                        pFVar20->next = (FunctionHandle *)0x0;
                        pFVar20->listed = false;
                        IntrusiveList<FunctionHandle>::push_back(&local_488,pFVar20);
                      }
                      else {
                        bVar9 = false;
                        bVar32 = false;
                        pFVar20 = local_488.head;
                        do {
                          pTVar5 = (pFVar20->function->type->arguments).head;
                          for (pTVar6 = (pFVar4->type->arguments).head;
                              (pTVar5 != (TypeHandle *)0x0 && (pTVar6 != (TypeHandle *)0x0));
                              pTVar6 = pTVar6->next) {
                            if (pTVar5->type != pTVar6->type) goto LAB_001700f1;
                            pTVar5 = pTVar5->next;
                          }
                          bVar32 = bVar9;
                          if (pTVar5 == pTVar6) {
                            bVar9 = true;
                            bVar32 = true;
                          }
LAB_001700f1:
                          pFVar20 = pFVar20->next;
                        } while ((pFVar20 != (FunctionHandle *)0x0) && (!bVar32));
                        if (!bVar32) goto LAB_00170104;
                      }
                      uVar30 = uVar30 + 1;
                    } while (uVar30 < ((ulong)local_340 & 0xffffffff));
                  }
                  setTypes.count = local_3e0.count;
                  setTypes.data = local_3e0.data;
                  setTypes._12_4_ = 0;
                  pTVar21 = ExpressionContext::GetFunctionSetType(ctx,setTypes);
                  iVar10 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
                  ppuVar31 = (undefined **)CONCAT44(extraout_var_13,iVar10);
                  (((TypeRef *)ppuVar31)->super_TypeBase).typeID = 0x27;
                  (((TypeRef *)ppuVar31)->super_TypeBase).name.begin = (char *)source;
                  (((TypeRef *)ppuVar31)->super_TypeBase).name.end = (char *)pTVar21;
                  (((TypeRef *)ppuVar31)->super_TypeBase).importModule = (ModuleData *)0x0;
                  *(undefined1 *)&(((TypeRef *)ppuVar31)->super_TypeBase).typeIndex = 0;
                  (((TypeRef *)ppuVar31)->super_TypeBase)._vptr_TypeBase =
                       (_func_int **)&PTR__ExprBase_00248e70;
                  (((TypeRef *)ppuVar31)->super_TypeBase).size = (longlong)local_488.head;
                  *(FunctionHandle **)&(((TypeRef *)ppuVar31)->super_TypeBase).padding =
                       local_488.tail;
                  (((TypeRef *)ppuVar31)->super_TypeBase).refType = local_4b0;
                  SmallArray<FunctionValue,_32U>::~SmallArray
                            ((SmallArray<FunctionValue,_32U> *)local_348);
                  SmallArray<TypeBase_*,_16U>::~SmallArray(&local_3e0);
                }
              }
            }
          }
        }
      }
    }
  }
  return (ExprBase *)(TypeRef *)ppuVar31;
}

Assistant:

ExprBase* CreateMemberAccess(ExpressionContext &ctx, SynBase *source, ExprBase *value, SynIdentifier *member, bool allowFailure)
{
	ExprBase* wrapped = value;

	if(TypeRef *refType = getType<TypeRef>(value->type))
	{
		value = new (ctx.get<ExprDereference>()) ExprDereference(source, refType->subType, value);

		if(TypeRef *refType = getType<TypeRef>(value->type))
		{
			wrapped = value;

			value = new (ctx.get<ExprDereference>()) ExprDereference(source, refType->subType, value);
		}
	}
	else if(ExprVariableAccess *node = getType<ExprVariableAccess>(value))
	{
		wrapped = new (ctx.get<ExprGetAddress>()) ExprGetAddress(source, ctx.GetReferenceType(value->type), new (ctx.get<VariableHandle>()) VariableHandle(node->source, node->variable));
	}
	else if(ExprDereference *node = getType<ExprDereference>(value))
	{
		wrapped = node->value;
	}
	else if(!isType<TypeRef>(wrapped->type))
	{
		if(!AssertValueExpression(ctx, source, wrapped))
			return new (ctx.get<ExprMemberAccess>()) ExprMemberAccess(source, ctx.GetErrorType(), value, NULL);

		SynBase *sourceInternal = ctx.MakeInternal(source);

		VariableData *storage = AllocateTemporary(ctx, sourceInternal, wrapped->type);

		ExprBase *assignment = CreateAssignment(ctx, sourceInternal, CreateVariableAccess(ctx, sourceInternal, storage, false), value);

		ExprBase *definition = new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(sourceInternal, ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(NULL, storage), assignment);

		wrapped = CreateSequence(ctx, source, definition, CreateGetAddress(ctx, sourceInternal, CreateVariableAccess(ctx, sourceInternal, storage, false)));
	}

	if(!member)
		return new (ctx.get<ExprMemberAccess>()) ExprMemberAccess(source, ctx.GetErrorType(), value, NULL);

	if(TypeArray *node = getType<TypeArray>(value->type))
	{
		if(member->name == InplaceStr("size"))
			return new (ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, ctx.typeInt, node->length);
	}

	if(isType<TypeRef>(wrapped->type))
	{
		if(ExprTypeLiteral *node = getType<ExprTypeLiteral>(value))
		{
			if(ExprBase *result = CreateTypeidMemberAccess(ctx, source, node->value, member))
				return result;
		}

		if(TypeStruct *node = getType<TypeStruct>(value->type))
		{
			// Search for a member variable
			for(MemberHandle *el = node->members.head; el; el = el->next)
			{
				if(el->variable->name->name == member->name)
				{
					// Member access only shifts an address, so we are left with a reference to get value from
					ExprMemberAccess *shift = new (ctx.get<ExprMemberAccess>()) ExprMemberAccess(source, ctx.GetReferenceType(el->variable->type), wrapped, new (ctx.get<VariableHandle>()) VariableHandle(member, el->variable));

					ExprBase *memberValue = new (ctx.get<ExprDereference>()) ExprDereference(source, el->variable->type, shift);

					if(el->variable->isReadonly)
						return new (ctx.get<ExprPassthrough>()) ExprPassthrough(memberValue->source, memberValue->type, memberValue);

					return memberValue;
				}
			}

			// Search for a member constant
			for(ConstantData *curr = node->constants.head; curr; curr = curr->next)
			{
				if(curr->name->name == member->name)
					return CreateLiteralCopy(ctx, source, curr->value);
			}
		}

		if(value->type == ctx.typeAutoRef)
			return CreateAutoRefFunctionSet(ctx, source, value, member->name);

		if(TypeClass *classType = getType<TypeClass>(value->type))
		{
			if(classType->baseClass != NULL || classType->extendable)
			{
				if(ExprBase *overloads = CreateVirtualFunctionSet(ctx, source, wrapped, member->name, classType))
					return overloads;
			}
		}

		// Check if a name resembles a type alias of the value class
		TypeBase *aliasType = NULL;

		if(TypeBase *type = LookupTypeByName(ctx, member->name.hash()))
		{
			if(type == value->type && type->name != member->name)
			{
				if(TypeClass *typeClass = getType<TypeClass>(type))
				{
					if(typeClass->proto)
						type = typeClass->proto;
				}

				aliasType = type;
			}
		}

		// Look for a member function
		ExprBase *mainFuncton = NULL;

		unsigned hash = NULLC::StringHashContinue(value->type->nameHash, "::");

		hash = NULLC::StringHashContinue(hash, member->name.begin, member->name.end);

		if(FunctionLookupChain function = LookupFunctionChainByName(ctx, hash))
			mainFuncton = CreateFunctionAccess(ctx, source, function, wrapped);

		if(!mainFuncton && aliasType)
			mainFuncton = CreateConstructorAccess(ctx, source, value->type, false, wrapped);

		if(!mainFuncton)
		{
			if(TypeArray *node = getType<TypeArray>(value->type))
			{
				TypeUnsizedArray *arrayType = ctx.GetUnsizedArrayType(node->subType);

				unsigned hash = NULLC::StringHashContinue(arrayType->nameHash, "::");

				hash = NULLC::StringHashContinue(hash, member->name.begin, member->name.end);

				if(FunctionLookupChain function = LookupFunctionChainByName(ctx, hash))
				{
					wrapped = CreateCast(ctx, source, wrapped, ctx.GetReferenceType(arrayType), false);

					return CreateFunctionAccess(ctx, source, function, wrapped);
				}
			}
		}

		ExprBase *baseFunction = NULL;

		// Look for a member function in a generic class base
		if(TypeClass *classType = getType<TypeClass>(value->type))
		{
			if(TypeGenericClassProto *protoType = classType->proto)
			{
				unsigned hash = NULLC::StringHashContinue(protoType->nameHash, "::");

				hash = NULLC::StringHashContinue(hash, member->name.begin, member->name.end);

				if(FunctionLookupChain function = LookupFunctionChainByName(ctx, hash))
					baseFunction = CreateFunctionAccess(ctx, source, function, wrapped);

				if(!baseFunction && aliasType)
					baseFunction = CreateConstructorAccess(ctx, source, protoType, false, wrapped);
			}
		}

		// Add together instantiated and generic base functions
		if(mainFuncton && baseFunction)
		{
			SmallArray<TypeBase*, 16> types(ctx.allocator);
			IntrusiveList<FunctionHandle> overloads;

			// Collect a set of available functions
			SmallArray<FunctionValue, 32> functions(ctx.allocator);

			GetNodeFunctions(ctx, source, mainFuncton, functions);
			GetNodeFunctions(ctx, source, baseFunction, functions);

			for(unsigned i = 0; i < functions.size(); i++)
			{
				FunctionValue function = functions[i];

				bool instantiated = false;

				for(FunctionHandle *curr = overloads.head; curr && !instantiated; curr = curr->next)
				{
					if(SameArguments(curr->function->type, function.function->type))
						instantiated = true;
				}

				if(instantiated)
					continue;

				types.push_back(function.function->type);
				overloads.push_back(new (ctx.get<FunctionHandle>()) FunctionHandle(function.function));
			}

			TypeFunctionSet *type = ctx.GetFunctionSetType(types);

			return new (ctx.get<ExprFunctionOverloadSet>()) ExprFunctionOverloadSet(source, type, overloads, wrapped);
		}

		if(mainFuncton)
			return mainFuncton;

		if(baseFunction)
		{
			if(ExprFunctionAccess *node = getType<ExprFunctionAccess>(baseFunction))
			{
				if(node->function->scope->ownerType && node->function->scope->ownerType->isGeneric && !node->function->type->isGeneric)
				{
					if(FunctionValue bestOverload = GetFunctionForType(ctx, source, baseFunction, node->function->type))
						return new (ctx.get<ExprFunctionAccess>()) ExprFunctionAccess(bestOverload.source, bestOverload.function->type, bestOverload.function, bestOverload.context);
				}
			}

			return baseFunction;
		}

		// Look for an accessor
		hash = NULLC::StringHashContinue(hash, "$");

		ExprBase *access = NULL;

		if(FunctionLookupChain function = LookupFunctionChainByName(ctx, hash))
			access = CreateFunctionAccess(ctx, source, function, wrapped);

		if(!access)
		{
			if(TypeArray *node = getType<TypeArray>(value->type))
			{
				TypeUnsizedArray *arrayType = ctx.GetUnsizedArrayType(node->subType);

				unsigned hash = NULLC::StringHashContinue(arrayType->nameHash, "::");

				hash = NULLC::StringHashContinue(hash, member->name.begin, member->name.end);

				if(FunctionLookupChain function = LookupFunctionChainByName(ctx, hash))
				{
					wrapped = CreateCast(ctx, source, wrapped, ctx.GetReferenceType(arrayType), false);

					access = CreateFunctionAccess(ctx, source, function, wrapped);
				}
			}
		}

		if(access)
		{
			ExprBase *call = CreateFunctionCall(ctx, source, access, IntrusiveList<TypeHandle>(), NULL, false);;

			if(TypeRef *refType = getType<TypeRef>(call->type))
				return new (ctx.get<ExprDereference>()) ExprDereference(source, refType->subType, call);

			return call;
		}

		// Look for an accessor function in a generic class base
		if(TypeClass *classType = getType<TypeClass>(value->type))
		{
			if(TypeGenericClassProto *protoType = classType->proto)
			{
				unsigned hash = NULLC::StringHashContinue(protoType->nameHash, "::");

				hash = NULLC::StringHashContinue(hash, member->name.begin, member->name.end);

				// Look for an accessor
				hash = NULLC::StringHashContinue(hash, "$");

				if(FunctionLookupChain function = LookupFunctionChainByName(ctx, hash))
				{
					ExprBase *access = CreateFunctionAccess(ctx, source, function, wrapped);

					ExprBase *call = CreateFunctionCall(ctx, source, access, IntrusiveList<TypeHandle>(), NULL, false);

					if(TypeRef *refType = getType<TypeRef>(call->type))
						return new (ctx.get<ExprDereference>()) ExprDereference(source, refType->subType, call);

					return call;
				}
			}
		}

		if(allowFailure)
			return NULL;

		Report(ctx, source, "ERROR: member variable or function '%.*s' is not defined in class '%.*s'", FMT_ISTR(member->name), FMT_ISTR(value->type->name));

		return new (ctx.get<ExprMemberAccess>()) ExprMemberAccess(source, ctx.GetErrorType(), value, NULL);
	}

	Stop(ctx, source, "ERROR: can't access member '%.*s' of type '%.*s'", FMT_ISTR(member->name), FMT_ISTR(value->type->name));

	return NULL;
}